

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O1

int ffcphd(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  char cVar1;
  int iVar2;
  FITSfile *pFVar3;
  byte bVar4;
  int iVar5;
  char *__ptr;
  char *pcVar6;
  long lVar7;
  int nkeys;
  long naxis;
  long naxes [1];
  char comm [73];
  int local_9c;
  long local_98;
  long local_90;
  char local_88 [24];
  undefined7 uStack_70;
  undefined1 uStack_69;
  undefined2 uStack_68;
  undefined1 uStack_66;
  undefined1 uStack_65;
  
  iVar5 = *status;
  if (iVar5 < 1) {
    if (infptr == outfptr) {
      *status = 0x65;
      iVar5 = 0x65;
    }
    else {
      if (infptr->HDUposition != infptr->Fptr->curhdu) {
        ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
      }
      iVar5 = ffghsp(infptr,&local_9c,(int *)0x0,status);
      if (iVar5 < 1) {
        __ptr = (char *)malloc((long)local_9c * 0x51);
        if (__ptr == (char *)0x0) {
          *status = 0x71;
          return 0x71;
        }
        if (0 < local_9c) {
          lVar7 = 0;
          pcVar6 = __ptr;
          do {
            lVar7 = lVar7 + 1;
            ffgrec(infptr,(int)lVar7,pcVar6,status);
            pcVar6 = pcVar6 + 0x51;
          } while (lVar7 < local_9c);
        }
        iVar5 = infptr->HDUposition;
        local_98 = -1;
        if (infptr->Fptr->hdutype == 0) {
          ffgkyj(infptr,"NAXIS",&local_98,(char *)0x0,status);
        }
        if (outfptr->HDUposition != outfptr->Fptr->curhdu) {
          ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
        }
        pFVar3 = outfptr->Fptr;
        if (pFVar3->headend != pFVar3->headstart[pFVar3->curhdu]) {
          ffcrhd(outfptr,status);
        }
        bVar4 = 1;
        if (outfptr->HDUposition == 0) {
          if (local_98 < 0) {
            ffcrim(outfptr,8,0,&local_90,status);
            ffcrhd(outfptr,status);
          }
          else {
            bVar4 = 0;
          }
        }
        iVar2 = *status;
        if (0 < iVar2) {
          free(__ptr);
          return iVar2;
        }
        if ((bool)(iVar5 != 0 | bVar4 ^ 1)) {
          if ((bool)(iVar5 != 0 & (bVar4 ^ 1))) {
            builtin_strncpy(local_88 + 0x10,"m to FIT",8);
            uStack_70 = 0x646e6174732053;
            builtin_strncpy(local_88,"file does confor",0x10);
            uStack_69 = 0x61;
            uStack_68 = 0x6472;
            uStack_66 = 0;
            ffpkyl(outfptr,"SIMPLE",1,local_88,status);
            if (-2 < local_98) {
              lVar7 = 0;
              pcVar6 = __ptr;
              do {
                pcVar6 = pcVar6 + 0x51;
                ffprec(outfptr,pcVar6,status);
                lVar7 = lVar7 + 1;
              } while (lVar7 < local_98 + 2);
            }
            builtin_strncpy(local_88 + 0x10," contain",8);
            uStack_70 = 0x736e6574786520;
            uStack_69 = 0x69;
            builtin_strncpy(local_88,"FITS dataset may",0x10);
            uStack_68 = 0x6e6f;
            uStack_66 = 0x73;
            uStack_65 = 0;
            ffpkyl(outfptr,"EXTEND",1,local_88,status);
            ffprec(outfptr,
                   "COMMENT   FITS (Flexible Image Transport System) format is defined in \'Astronomy"
                   ,status);
            ffprec(outfptr,
                   "COMMENT   and Astrophysics\', volume 376, page 359; bibcode: 2001A&A...376..359H"
                   ,status);
            if ((int)local_98 + 3 < local_9c) {
              lVar7 = (long)((int)local_98 + 3);
              pcVar6 = __ptr + lVar7 * 0x51;
              do {
                if (*pcVar6 == 'G') {
                  iVar5 = strncmp(pcVar6,"GCOUNT  ",8);
joined_r0x0011ee74:
                  if (iVar5 != 0) goto LAB_0011ee76;
                }
                else {
                  if (*pcVar6 == 'P') {
                    iVar5 = strncmp(pcVar6,"PCOUNT  ",8);
                    goto joined_r0x0011ee74;
                  }
LAB_0011ee76:
                  ffprec(outfptr,pcVar6,status);
                }
                lVar7 = lVar7 + 1;
                pcVar6 = pcVar6 + 0x51;
              } while (lVar7 < local_9c);
            }
          }
          else if (0 < local_9c) {
            lVar7 = 0;
            pcVar6 = __ptr;
            do {
              ffprec(outfptr,pcVar6,status);
              lVar7 = lVar7 + 1;
              pcVar6 = pcVar6 + 0x51;
            } while (lVar7 < local_9c);
          }
        }
        else {
          builtin_strncpy(local_88,"IMAGE extension",0x10);
          ffpkys(outfptr,"XTENSION","IMAGE",local_88,status);
          if (-2 < local_98) {
            lVar7 = 0;
            pcVar6 = __ptr;
            do {
              pcVar6 = pcVar6 + 0x51;
              ffprec(outfptr,pcVar6,status);
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_98 + 2);
          }
          builtin_strncpy(local_88,"number of random group p",0x18);
          uStack_70 = 0x6574656d617261;
          uStack_69 = 0x72;
          uStack_68 = 0x73;
          ffpkyj(outfptr,"PCOUNT",0,local_88,status);
          builtin_strncpy(local_88,"number of random groups",0x18);
          ffpkyj(outfptr,"GCOUNT",1,local_88,status);
          if ((int)local_98 + 3 < local_9c) {
            lVar7 = (long)((int)local_98 + 3);
            pcVar6 = __ptr + lVar7 * 0x51;
            do {
              cVar1 = *pcVar6;
              if (((cVar1 != 'E') || (iVar5 = strncmp(pcVar6,"EXTEND  ",8), iVar5 != 0)) &&
                 ((cVar1 != 'C' ||
                  ((iVar5 = strncmp(pcVar6,
                                    "COMMENT   FITS (Flexible Image Transport System) format is",
                                    0x3a), iVar5 != 0 &&
                   (iVar5 = strncmp(pcVar6,"COMMENT   and Astrophysics\', volume 376, page 3",0x2f),
                   iVar5 != 0)))))) {
                ffprec(outfptr,pcVar6,status);
              }
              lVar7 = lVar7 + 1;
              pcVar6 = pcVar6 + 0x51;
            } while (lVar7 < local_9c);
          }
        }
        free(__ptr);
      }
      iVar5 = *status;
    }
  }
  return iVar5;
}

Assistant:

int ffcphd(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
/*
  copy the header keywords from infptr to outfptr.
*/
{
    int nkeys, ii, inPrim = 0, outPrim = 0;
    long naxis, naxes[1];
    char *card, comm[FLEN_COMMENT];
    char *tmpbuff;

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    /* set the input pointer to the correct HDU */
    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);

    if (ffghsp(infptr, &nkeys, NULL, status) > 0) /* get no. of keywords */
        return(*status);

    /* create a memory buffer to hold the header records */
    tmpbuff = (char*) malloc(nkeys*FLEN_CARD*sizeof(char));
    if (!tmpbuff)
        return(*status = MEMORY_ALLOCATION);

    /* read all of the header records in the input HDU */
    for (ii = 0; ii < nkeys; ii++)
      ffgrec(infptr, ii+1, tmpbuff + (ii * FLEN_CARD), status);

    if (infptr->HDUposition == 0)  /* set flag if this is the Primary HDU */
       inPrim = 1;

    /* if input is an image hdu, get the number of axes */
    naxis = -1;   /* negative if HDU is a table */
    if ((infptr->Fptr)->hdutype == IMAGE_HDU)
        ffgkyj(infptr, "NAXIS", &naxis, NULL, status);

    /* set the output pointer to the correct HDU */
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);

    /* check if output header is empty; if not create new empty HDU */
    if ((outfptr->Fptr)->headend !=
        (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu] )
           ffcrhd(outfptr, status);   

    if (outfptr->HDUposition == 0)
    {
        if (naxis < 0)
        {
            /* the input HDU is a table, so we have to create */
            /* a dummy Primary array before copying it to the output */
            ffcrim(outfptr, 8, 0, naxes, status);
            ffcrhd(outfptr, status); /* create new empty HDU */
        }
        else
        {
            /* set flag that this is the Primary HDU */
            outPrim = 1;
        }
    }

    if (*status > 0)  /* check for errors before proceeding */
    {
        free(tmpbuff);
        return(*status);
    }
    if ( inPrim == 1 && outPrim == 0 )
    {
        /* copying from primary array to image extension */
        strcpy(comm, "IMAGE extension");
        ffpkys(outfptr, "XTENSION", "IMAGE", comm, status);

        /* copy BITPIX through NAXISn keywords */
        for (ii = 1; ii < 3 + naxis; ii++)
        {
            card = tmpbuff + (ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }

        strcpy(comm, "number of random group parameters");
        ffpkyj(outfptr, "PCOUNT", 0, comm, status);
  
        strcpy(comm, "number of random groups");
        ffpkyj(outfptr, "GCOUNT", 1, comm, status);


        /* copy remaining keywords, excluding EXTEND, and reference COMMENT keywords */
        for (ii = 3 + naxis ; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            if (FSTRNCMP(card, "EXTEND  ", 8) &&
                FSTRNCMP(card, "COMMENT   FITS (Flexible Image Transport System) format is", 58) && 
                FSTRNCMP(card, "COMMENT   and Astrophysics', volume 376, page 3", 47) )
            {
                 ffprec(outfptr, card, status);
            }
        }
    }
    else if ( inPrim == 0 && outPrim == 1 )
    {
        /* copying between image extension and primary array */
        strcpy(comm, "file does conform to FITS standard");
        ffpkyl(outfptr, "SIMPLE", TRUE, comm, status);

        /* copy BITPIX through NAXISn keywords */
        for (ii = 1; ii < 3 + naxis; ii++)
        {
            card = tmpbuff + (ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }

        /* add the EXTEND keyword */
        strcpy(comm, "FITS dataset may contain extensions");
        ffpkyl(outfptr, "EXTEND", TRUE, comm, status);

      /* write standard block of self-documentating comments */
      ffprec(outfptr,
      "COMMENT   FITS (Flexible Image Transport System) format is defined in 'Astronomy",
      status);
      ffprec(outfptr,
      "COMMENT   and Astrophysics', volume 376, page 359; bibcode: 2001A&A...376..359H",
      status);

        /* copy remaining keywords, excluding pcount, gcount */
        for (ii = 3 + naxis; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            if (FSTRNCMP(card, "PCOUNT  ", 8) && FSTRNCMP(card, "GCOUNT  ", 8))
            {
                 ffprec(outfptr, card, status);
            }
        }
    }
    else
    {
        /* input and output HDUs are same type; simply copy all keywords */
        for (ii = 0; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }
    }

    free(tmpbuff);
    return(*status);
}